

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O3

void DumpData(ostream *out,void *buffer,size_t len)

{
  ostream *poVar1;
  long lVar2;
  char cVar3;
  undefined4 in_EAX;
  ulong uVar4;
  int i;
  long lVar5;
  undefined4 uStack_38;
  undefined4 local_34;
  
  lVar5 = *(long *)(*(long *)out + -0x18);
  local_34 = *(undefined4 *)(out + lVar5 + 0x18);
  if (len != 0) {
    _uStack_38 = CONCAT44(local_34,in_EAX);
    uVar4 = 0;
    do {
      lVar5 = *(long *)out;
      *(uint *)(out + *(long *)(lVar5 + -0x18) + 0x18) =
           *(uint *)(out + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
      *(undefined8 *)(out + *(long *)(lVar5 + -0x18) + 0x10) = 8;
      poVar1 = out + *(long *)(lVar5 + -0x18);
      if (out[*(long *)(lVar5 + -0x18) + 0xe1] == (ostream)0x0) {
        std::ios::widen((char)poVar1);
        poVar1[0xe1] = (ostream)0x1;
      }
      poVar1[0xe0] = (ostream)0x30;
      std::ostream::_M_insert<unsigned_long>((ulong)out);
      lVar5 = 0;
      do {
        if (uVar4 + lVar5 < len) {
          std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
          lVar2 = *(long *)out;
          *(uint *)(out + *(long *)(lVar2 + -0x18) + 0x18) =
               *(uint *)(out + *(long *)(lVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
          *(undefined8 *)(out + *(long *)(lVar2 + -0x18) + 0x10) = 2;
          poVar1 = out + *(long *)(lVar2 + -0x18);
          if (out[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
            std::ios::widen((char)poVar1);
            poVar1[0xe1] = (ostream)0x1;
          }
          poVar1[0xe0] = (ostream)0x30;
          std::ostream::_M_insert<unsigned_long>((ulong)out);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(out,"   ",3);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 8);
      std::__ostream_insert<char,std::char_traits<char>>(out,"  ",2);
      lVar5 = 8;
      do {
        if (uVar4 + lVar5 < len) {
          std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
          lVar2 = *(long *)out;
          *(uint *)(out + *(long *)(lVar2 + -0x18) + 0x18) =
               *(uint *)(out + *(long *)(lVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
          *(undefined8 *)(out + *(long *)(lVar2 + -0x18) + 0x10) = 2;
          poVar1 = out + *(long *)(lVar2 + -0x18);
          if (out[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
            std::ios::widen((char)poVar1);
            poVar1[0xe1] = (ostream)0x1;
          }
          poVar1[0xe0] = (ostream)0x30;
          std::ostream::_M_insert<unsigned_long>((ulong)out);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(out,"   ",3);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x10);
      std::__ostream_insert<char,std::char_traits<char>>(out,"  ",2);
      lVar5 = 0;
      do {
        cVar3 = ' ';
        if ((uVar4 + lVar5 < len) && (cVar3 = *(char *)((long)buffer + lVar5), cVar3 < ' ')) {
          cVar3 = '.';
        }
        uStack_38 = CONCAT13(cVar3,(undefined3)uStack_38);
        std::__ostream_insert<char,std::char_traits<char>>(out,(char *)((long)&uStack_38 + 3),1);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x10);
      std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
      buffer = (void *)((long)buffer + 0x10);
      uVar4 = uVar4 + 0x10;
    } while (uVar4 < len);
    lVar5 = *(long *)(*(long *)out + -0x18);
  }
  *(undefined4 *)(out + lVar5 + 0x18) = local_34;
  return;
}

Assistant:

void DumpData(std::ostream& out, void* buffer, size_t len)
{
    std::ios_base::fmtflags flags = out.flags();
    const uint8_t* data = reinterpret_cast<const uint8_t*>(buffer);
    size_t index = 0;
    while (index < len)
    {
        out << std::hex << std::setw(8) << std::setfill('0') << index;
        for (int i = 0; i < 8; i++)
        {
            if (index + i < len)
            {
                out << " " << std::hex << std::setw(2) << std::setfill('0') << (uint32_t)data[i];
            }
            else
            {
                out << "   ";
            }
        }
        out << "  ";
        for (int i = 8; i < 16; i++)
        {
            if (index + i < len)
            {
                out << " " << std::hex << std::setw(2) << std::setfill('0') << (uint32_t)data[i];
            }
            else
            {
                out << "   ";
            }
        }
        out << "  ";
        for (int i = 0; i < 16; i++)
        {
            char ch = (index + i < len ? data[i] : ' ');
            out << ((ch < 32) ? '.' : ch);
        }
        out << "\n";
        data += 16;
        index += 16;
    }
    out.flags(flags);
}